

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

double TasGrid::Optimizer::getDerivative<(TasGrid::TypeOneDRule)20>
                 (CurrentNodes<(TasGrid::TypeOneDRule)20> *current,double x)

{
  uchar *tbs;
  size_type sVar1;
  size_t *siglen;
  size_t *siglen_00;
  vector<double,_std::allocator<double>_> *nodes;
  uchar *sig;
  EVP_PKEY_CTX *pEVar2;
  size_t in_R8;
  double extraout_XMM0_Qa;
  double dVar3;
  double dVar4;
  double extraout_XMM0_Qa_00;
  uchar *local_68;
  size_t i;
  double sum;
  undefined1 local_48 [8];
  vector<double,_std::allocator<double>_> lag_less1;
  vector<double,_std::allocator<double>_> lag;
  double x_local;
  CurrentNodes<(TasGrid::TypeOneDRule)20> *current_local;
  
  evalLagrange((vector<double,_std::allocator<double>_> *)
               &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&current->nodes,&current->coeff,x);
  nodes = &current->nodes_less1;
  evalLagrange((vector<double,_std::allocator<double>_> *)local_48,nodes,&current->coeff_less1,x);
  i = 0;
  local_68 = (uchar *)0x0;
  while( true ) {
    tbs = (uchar *)::std::vector<double,_std::allocator<double>_>::size
                             ((vector<double,_std::allocator<double>_> *)local_48);
    if (tbs <= local_68) break;
    ::std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)
               &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(size_type)local_68);
    pEVar2 = (EVP_PKEY_CTX *)local_48;
    sig = local_68;
    ::std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)pEVar2,(size_type)local_68);
    Maths::sign(pEVar2,sig,siglen,tbs,in_R8);
    dVar3 = differentiateBasis(&current->nodes,&current->coeff,(size_t)local_68,x);
    nodes = &current->coeff_less1;
    dVar4 = differentiateBasis(&current->nodes_less1,nodes,(size_t)local_68,x);
    i = (size_t)(extraout_XMM0_Qa * (dVar3 - dVar4) + (double)i);
    local_68 = local_68 + 1;
  }
  pEVar2 = (EVP_PKEY_CTX *)
           &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::back
            ((vector<double,_std::allocator<double>_> *)pEVar2);
  Maths::sign(pEVar2,(uchar *)nodes,siglen_00,tbs,in_R8);
  sVar1 = ::std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)
                     &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  dVar3 = differentiateBasis(&current->nodes,&current->coeff,sVar1 - 1,x);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_48);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &lag_less1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return extraout_XMM0_Qa_00 * dVar3 + (double)i;
}

Assistant:

double getDerivative<rule_mindeltaodd>(CurrentNodes<rule_mindeltaodd> const& current, double x){
    auto lag       = evalLagrange(current.nodes,       current.coeff,       x);
    auto lag_less1 = evalLagrange(current.nodes_less1, current.coeff_less1, x);

    double sum = 0.0;
    for(size_t i=0; i<lag_less1.size(); i++){
        sum += Maths::sign(lag[i] - lag_less1[i])
                * (differentiateBasis(current.nodes,        current.coeff,       i, x)
                   - differentiateBasis(current.nodes_less1, current.coeff_less1, i, x));
    }
    return sum + Maths::sign(lag.back()) * differentiateBasis(current.nodes, current.coeff, lag.size() - 1, x);
}